

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O1

bool __thiscall
ON_SerialNumberMap::Internal_HashTableRemoveSerialNumberBlock
          (ON_SerialNumberMap *this,ON_SN_BLOCK *blk)

{
  uint uVar1;
  SN_ELEMENT **ppSVar2;
  bool bVar3;
  SN_ELEMENT *pSVar4;
  SN_ELEMENT *pSVar5;
  uint uVar6;
  SN_ELEMENT **ppSVar7;
  ON__UINT32 OVar8;
  ON__UINT64 OVar9;
  SN_ELEMENT *pSVar10;
  
  if ((this->m_bHashTableIsValid == '\0') ||
     (OVar8 = blk->m_count, this->m_active_id_count <= (ulong)(OVar8 << 7))) {
    bVar3 = false;
  }
  else {
    bVar3 = true;
    if (OVar8 != 0) {
      OVar9 = this->m_active_id_count;
      pSVar5 = blk->m_sn;
      uVar1 = this->m_hash_block_count;
      do {
        if (pSVar5->m_id_active != '\0') {
          uVar6 = pSVar5->m_id_crc32;
          ppSVar2 = this->m_hash_table_blocks[(ulong)uVar6 % (ulong)uVar1];
          uVar6 = uVar6 / 0xffa + (uVar6 / 0xff4024) * -0xffa;
          pSVar4 = ppSVar2[uVar6];
          if (pSVar4 != (SN_ELEMENT *)0x0) {
            if (pSVar4 == pSVar5) {
              pSVar10 = (SN_ELEMENT *)0x0;
            }
            else {
              do {
                pSVar10 = pSVar4;
                pSVar4 = pSVar10->m_next;
                if (pSVar4 == (SN_ELEMENT *)0x0) goto LAB_004d6fe5;
              } while (pSVar4 != pSVar5);
            }
            OVar9 = OVar9 - 1;
            this->m_active_id_count = OVar9;
            ppSVar7 = &pSVar10->m_next;
            if (pSVar10 == (SN_ELEMENT *)0x0) {
              ppSVar7 = ppSVar2 + uVar6;
            }
            *ppSVar7 = pSVar4->m_next;
          }
        }
LAB_004d6fe5:
        OVar8 = OVar8 - 1;
        pSVar5 = pSVar5 + 1;
      } while (OVar8 != 0);
    }
  }
  return bVar3;
}

Assistant:

bool ON_SerialNumberMap::Internal_HashTableRemoveSerialNumberBlock(const ON_SN_BLOCK* blk)
{
  // quickly remove every id in the block from the hash table.
  // This is done when the block is small compared to the
  // size of the hash table and removing the elements from
  // the hash table, rearranging the block, and then adding
  // the elements back into the hash table is faster than
  // simply rebuilding the hash table.
  //
  // The 128 multiplier is determined as follows:
  // - C = average number of elements with the same hash index
  //     = m_active_id_count/m_hash_capacity.
  // - D = cost of destroying hash table = time to memset the table
  //       to zero.
  // - H = cost of calculating the hash table index of an id.
  // - A = The cost of adding an element to the hash table is
  //       H + two pointer assignments with is essentially H.
  // - F = The average cost of finding an element in the hash
  //       table is H plus going through half the linked list
  //       of elements at that hash index (C/2 pointer dereferences).
  // - B = number of elements in a block.
  // - I = (number times a valid hash table is destroyed)/
  //       (number of times the hash table is rebuilt).
  // - R = rebuild cost = A*m_active_id_count.
  // - Keeping the the has table up to date only makes sense if
  //   R > I*(A+F)*active_id_count
  //   it is needed often enough to justify ...
  bool rc = false;
  if ( m_bHashTableIsValid && m_active_id_count > 128*blk->m_count )
  {
    const SN_ELEMENT* e;
    struct SN_ELEMENT** hash_table_block;
    SN_ELEMENT* h;
    SN_ELEMENT* prev;
    ON__UINT32 i;
    rc = true;
    for (e = blk->m_sn, i = blk->m_count; i--; e++)
    {
      if ( 0 == e->m_id_active )
        continue;
      hash_table_block = Internal_HashTableBlock(e->m_id_crc32);
      ON__UINT32 hash_i = Internal_HashTableBlockRowIndex(e->m_id_crc32);
      prev = 0;
      for ( h = hash_table_block[hash_i]; nullptr !=  h; h = h->m_next )
      {
        if (h == e)
        {
          // Do not change value of SN_ELEMENT's m_id_active.
          // This value is needed by AddBlockToHashTableHelper()
          // when it add the element back in.
          m_active_id_count--;
          if (prev)
            prev->m_next = h->m_next;
          else
            hash_table_block[hash_i] = h->m_next;
          break;
        }
        prev = h;
      }
    }
  }
  return rc;
}